

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O2

size_t __thiscall common::SettingsSpan::negated(SettingsSpan *this)

{
  long lVar1;
  size_t sVar2;
  bool bVar3;
  size_t sVar4;
  long lVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = this->size;
  lVar5 = this->size * 0x58;
  do {
    sVar4 = sVar2;
    if (sVar4 == 0) break;
    bVar3 = UniValue::isFalse((UniValue *)((long)&this->data[-1].typ + lVar5));
    sVar2 = sVar4 - 1;
    lVar5 = lVar5 + -0x58;
  } while (!bVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return sVar4;
}

Assistant:

size_t SettingsSpan::negated() const
{
    for (size_t i = size; i > 0; --i) {
        if (data[i - 1].isFalse()) return i; // Return number of negated values (position of last false value)
    }
    return 0;
}